

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadIdentifier(AsciiParser *this,string *token)

{
  int *piVar1;
  string sVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  StreamReader *pSVar6;
  ulong uVar7;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar6 = this->_sr;
  uVar7 = pSVar6->length_;
  uVar3 = pSVar6->idx_;
  if (uVar3 + 1 <= uVar7) {
    sVar2 = *(string *)(pSVar6->binary_ + uVar3);
    pSVar6->idx_ = uVar3 + 1;
    if (((char)sVar2 == 0x5f) || (iVar4 = isalpha((int)(char)sVar2), iVar4 != 0)) {
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      local_1d8 = sVar2;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
      pSVar6 = this->_sr;
      uVar7 = pSVar6->idx_;
      if (uVar7 < pSVar6->length_) {
        while( true ) {
          sVar2 = *(string *)(pSVar6->binary_ + uVar7);
          if (sVar2 == (string)0x0) break;
          pSVar6->idx_ = uVar7 + 1;
          if ((sVar2 != (string)0x5f) && (iVar4 = isalnum((int)(char)sVar2), iVar4 == 0)) {
            if ((uVar7 < 0x7fffffffffffffff) && (uVar7 <= pSVar6->length_)) {
              pSVar6->idx_ = uVar7;
            }
            break;
          }
          piVar1 = &(this->_curr_cursor).col;
          *piVar1 = *piVar1 + 1;
          local_1d8 = sVar2;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
          pSVar6 = this->_sr;
          uVar7 = pSVar6->idx_;
          if (pSVar6->length_ <= uVar7) break;
        }
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)token,&local_1d8);
      if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
        operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
      }
      bVar5 = true;
      goto LAB_00359f0a;
    }
    if (uVar3 <= uVar7 && uVar3 < 0x7fffffffffffffff) {
      pSVar6->idx_ = uVar3;
    }
  }
  bVar5 = false;
LAB_00359f0a:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar5;
}

Assistant:

bool AsciiParser::ReadIdentifier(std::string *token) {
  // identifier = (`_` | [a-zA-Z]) (`_` | [a-zA-Z0-9]+)
  std::stringstream ss;

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      DCOUT("read1 failed.");
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalpha(int(c))) {
      DCOUT(fmt::format("Invalid identiefier: '{}'", c));
      _sr->seek_from_current(-1);
      return false;
    }
    _curr_cursor.col++;

    ss << c;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (!std::isalnum(int(c))) {
      _sr->seek_from_current(-1);
      break;  // end of identifier(e.g. ' ')
    }

    _curr_cursor.col++;

    ss << c;
  }

  (*token) = ss.str();
  return true;
}